

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O3

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::~op_queue
          (op_queue<asio::detail::reactor_op> *this)

{
  reactor_op *prVar1;
  undefined8 uVar2;
  reactor_op *tmp;
  reactor_op *prVar3;
  undefined4 local_30 [2];
  undefined8 local_28;
  
  prVar3 = this->front_;
  if (prVar3 != (reactor_op *)0x0) {
    uVar2 = std::_V2::system_category();
    do {
      prVar1 = *(reactor_op **)prVar3;
      this->front_ = prVar1;
      if (prVar1 == (reactor_op *)0x0) {
        this->back_ = (reactor_op *)0x0;
      }
      *(long *)prVar3 = 0;
      local_30[0] = 0;
      local_28 = uVar2;
      (**(code **)(prVar3 + 8))(0,prVar3,local_30,0);
      prVar3 = this->front_;
    } while (prVar3 != (reactor_op *)0x0);
  }
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }